

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O1

void __thiscall cppcms::archive::archive(archive *this,archive *other)

{
  pointer pcVar1;
  
  (this->buffer_)._M_dataplus._M_p = (pointer)&(this->buffer_).field_2;
  pcVar1 = (other->buffer_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (other->buffer_)._M_string_length);
  this->ptr_ = other->ptr_;
  this->mode_ = other->mode_;
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

archive::archive(archive const &other) :
	buffer_(other.buffer_),
	ptr_(other.ptr_),
	mode_(other.mode_)
{
}